

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2780404::
SubpelVarianceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>
::TearDown(SubpelVarianceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>
           *this)

{
  uint8_t *memblk;
  
  if ((this->params_).use_high_bit_depth == false) {
    aom_free(this->src_);
    aom_free(this->ref_);
    memblk = this->sec_;
  }
  else {
    aom_free((void *)((long)this->src_ * 2));
    aom_free((void *)((long)this->ref_ * 2));
    memblk = (uint8_t *)((long)this->sec_ * 2);
  }
  aom_free(memblk);
  return;
}

Assistant:

void TearDown() override {
    if (!use_high_bit_depth()) {
      aom_free(src_);
      aom_free(ref_);
      aom_free(sec_);
    } else {
      aom_free(CONVERT_TO_SHORTPTR(src_));
      aom_free(CONVERT_TO_SHORTPTR(ref_));
      aom_free(CONVERT_TO_SHORTPTR(sec_));
    }
  }